

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::OutputFile::breakScanLine(OutputFile *this,int y,int offset,int length,char c)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  unsigned_long uVar2;
  OutputStreamMutex *pOVar3;
  OStream *pOVar4;
  ostream *poVar5;
  char *pcVar6;
  ArgExc *this_00;
  int iVar7;
  bool bVar8;
  char c_local;
  stringstream _iex_throw_s;
  ostream local_1a0 [376];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  c_local = c;
  std::mutex::lock((mutex *)&__mutex->__data);
  pDVar1 = this->_data;
  uVar2 = (pDVar1->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[(y - pDVar1->minY) / pDVar1->linesInBuffer];
  if (uVar2 != 0) {
    pOVar3 = pDVar1->_streamData;
    pOVar3->currentPosition = 0;
    pOVar4 = pOVar3->os;
    (*pOVar4->_vptr_OStream[4])(pOVar4,uVar2 + (long)offset);
    iVar7 = 0;
    if (0 < length) {
      iVar7 = length;
    }
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      pOVar4 = this->_data->_streamData->os;
      (*pOVar4->_vptr_OStream[2])(pOVar4,&c_local,1);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar5 = std::operator<<(local_1a0,"Cannot overwrite scan line ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,y);
  poVar5 = std::operator<<(poVar5,". The scan line has not yet been stored in file \"");
  pcVar6 = fileName(this);
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::operator<<(poVar5,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
OutputFile::breakScanLine (int y, int offset, int length, char c)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    uint64_t position =
        _data->lineOffsets[(y - _data->minY) / _data->linesInBuffer];

    if (!position)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot overwrite scan line "
                << y
                << ". "
                   "The scan line has not yet been stored in "
                   "file \""
                << fileName () << "\".");

    _data->_streamData->currentPosition = 0;
    _data->_streamData->os->seekp (position + offset);

    for (int i = 0; i < length; ++i)
        _data->_streamData->os->write (&c, 1);
}